

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.cpp
# Opt level: O0

void __thiscall
Diligent::anon_unknown_77::BindResourceHelper::operator()
          (BindResourceHelper *this,BindResourceInfo *BindInfo)

{
  bool bVar1;
  SET_SHADER_RESOURCE_FLAGS SVar2;
  Char *pCVar3;
  IDeviceObject *pIVar4;
  char *in_R8;
  char (*in_R9) [205];
  undefined1 local_b8 [8];
  string msg_3;
  undefined1 local_90 [8];
  string msg_2;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  BindResourceInfo *BindInfo_local;
  BindResourceHelper *this_local;
  
  msg.field_2._8_8_ = BindInfo;
  if (this->m_ArrayIndex != BindInfo->ArrayIndex) {
    FormatString<char[26],char[36]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_ArrayIndex == BindInfo.ArrayIndex",(char (*) [36])BindInfo);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    BindInfo = (BindResourceInfo *)0x141;
    DebugAssertionFailed
              (pCVar3,"operator()",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0x141);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (*(long *)msg.field_2._8_8_ == 0) {
    pIVar4 = Diligent::RefCntAutoPtr::operator_cast_to_IDeviceObject_
                       ((RefCntAutoPtr *)&this->m_DstRes->pObject);
    if (((pIVar4 != (IDeviceObject *)0x0) &&
        (this->m_ResDesc->VarType != SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC)) &&
       (SVar2 = Diligent::operator&(*(SET_SHADER_RESOURCE_FLAGS *)(msg.field_2._8_8_ + 8),
                                    SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE),
       SVar2 == SET_SHADER_RESOURCE_FLAG_NONE)) {
      FormatString<char[18],char_const*,char[100],char[205]>
                ((string *)local_b8,(Diligent *)"Shader variable \'",(char (*) [18])this->m_ResDesc,
                 (char **)
                 "\' is not dynamic, but is being reset to null. This is an error and may cause unpredicted behavior. "
                 ,(char (*) [100])
                  "If this is intended and you ensured proper synchronization, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. Otherwise, use another shader resource binding instance or label the variable as dynamic."
                 ,in_R9);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"operator()",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                 ,0x180);
      std::__cxx11::string::~string((string *)local_b8);
    }
    ShaderResourceCacheVk::ResetResource
              (this->m_ResourceCache,(uint)((ulong)*(undefined8 *)this->m_Attribs >> 0x3e) & 1,
               this->m_DstResCacheOffset);
  }
  else {
    switch(this->m_DstRes->Type) {
    case Sampler:
      bVar1 = PipelineResourceAttribsVk::IsImmutableSamplerAssigned(this->m_Attribs);
      if (bVar1) {
        msg_2.field_2._M_local_buf[0xf] = '\'';
        FormatString<char[57],char_const*,char>
                  ((string *)&stack0xffffffffffffff98,
                   (Diligent *)"Attempting to assign a sampler to an immutable sampler \'",
                   (char (*) [57])this->m_ResDesc,(char **)((long)&msg_2.field_2 + 0xf),in_R8);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                   ,0x169);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
      }
      else {
        CacheSeparateSampler(this,(BindResourceInfo *)msg.field_2._8_8_);
      }
      break;
    case CombinedImageSampler:
    case SeparateImage:
    case StorageImage:
      CacheImage(this,(BindResourceInfo *)msg.field_2._8_8_);
      break;
    case UniformTexelBuffer:
    case StorageTexelBuffer:
    case StorageTexelBuffer_ReadOnly:
      CacheTexelBuffer(this,(BindResourceInfo *)msg.field_2._8_8_);
      break;
    case UniformBuffer:
    case UniformBufferDynamic:
      CacheUniformBuffer(this,(BindResourceInfo *)msg.field_2._8_8_);
      break;
    case StorageBuffer:
    case StorageBuffer_ReadOnly:
    case StorageBufferDynamic:
    case StorageBufferDynamic_ReadOnly:
      CacheStorageBuffer(this,(BindResourceInfo *)msg.field_2._8_8_);
      break;
    case InputAttachment:
    case InputAttachment_General:
      CacheInputAttachment(this,(BindResourceInfo *)msg.field_2._8_8_);
      break;
    case AccelerationStructure:
      CacheAccelerationStructure(this,(BindResourceInfo *)msg.field_2._8_8_);
      break;
    default:
      msg_3.field_2._12_4_ = ZEXT14(this->m_DstRes->Type);
      FormatString<char[23],unsigned_int>
                ((string *)local_90,(Diligent *)"Unknown resource type ",
                 (char (*) [23])((long)&msg_3.field_2 + 0xc),(uint *)BindInfo);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"operator()",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                 ,0x176);
      std::__cxx11::string::~string((string *)local_90);
    }
  }
  return;
}

Assistant:

void BindResourceHelper::operator()(const BindResourceInfo& BindInfo) const
{
    VERIFY_EXPR(m_ArrayIndex == BindInfo.ArrayIndex);

    if (BindInfo.pObject != nullptr)
    {
        static_assert(static_cast<Uint32>(DescriptorType::Count) == 16, "Please update the switch below to handle the new descriptor type");
        switch (m_DstRes.Type)
        {
            case DescriptorType::UniformBuffer:
            case DescriptorType::UniformBufferDynamic:
                CacheUniformBuffer(BindInfo);
                break;

            case DescriptorType::StorageBuffer:
            case DescriptorType::StorageBuffer_ReadOnly:
            case DescriptorType::StorageBufferDynamic:
            case DescriptorType::StorageBufferDynamic_ReadOnly:
                CacheStorageBuffer(BindInfo);
                break;

            case DescriptorType::UniformTexelBuffer:
            case DescriptorType::StorageTexelBuffer:
            case DescriptorType::StorageTexelBuffer_ReadOnly:
                CacheTexelBuffer(BindInfo);
                break;

            case DescriptorType::StorageImage:
            case DescriptorType::SeparateImage:
            case DescriptorType::CombinedImageSampler:
                CacheImage(BindInfo);
                break;

            case DescriptorType::Sampler:
                if (!m_Attribs.IsImmutableSamplerAssigned())
                {
                    CacheSeparateSampler(BindInfo);
                }
                else
                {
                    // Immutable samplers are permanently bound into the set layout; later binding a sampler
                    // into an immutable sampler slot in a descriptor set is not allowed (13.2.1)
                    UNEXPECTED("Attempting to assign a sampler to an immutable sampler '", m_ResDesc.Name, '\'');
                }
                break;

            case DescriptorType::InputAttachment:
            case DescriptorType::InputAttachment_General:
                CacheInputAttachment(BindInfo);
                break;

            case DescriptorType::AccelerationStructure:
                CacheAccelerationStructure(BindInfo);
                break;

            default: UNEXPECTED("Unknown resource type ", static_cast<Uint32>(m_DstRes.Type));
        }
    }
    else
    {
        DEV_CHECK_ERR((m_DstRes.pObject == nullptr ||
                       m_ResDesc.VarType == SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC ||
                       (BindInfo.Flags & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) != 0),
                      "Shader variable '", m_ResDesc.Name, "' is not dynamic, but is being reset to null. This is an error and may cause unpredicted behavior. ",
                      "If this is intended and you ensured proper synchronization, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. "
                      "Otherwise, use another shader resource binding instance or label the variable as dynamic.");

        m_ResourceCache.ResetResource(m_Attribs.DescrSet, m_DstResCacheOffset);
    }
}